

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

Direction __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::HandleEquality
          (LoopPeelingInfo *this,SExpression lhs,SExpression rhs)

{
  int iVar1;
  SENode *pSVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SENode *pSVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int local_e8 [2];
  SExpression local_e0;
  SERecurrentNode *local_d0;
  SERecurrentNode *rec_node_3;
  SExpression rhs_cst_1;
  ScalarEvolutionAnalysis *local_b0;
  SERecurrentNode *rec_node_2;
  SExpression lhs_cst_1;
  SExpression local_88;
  SERecurrentNode *local_78;
  SERecurrentNode *rec_node_1;
  SExpression rhs_cst;
  SENode *local_58;
  SERecurrentNode *rec_node;
  SExpression lhs_cst;
  LoopPeelingInfo *this_local;
  SExpression rhs_local;
  SExpression lhs_local;
  
  rhs_local.node_ = (SENode *)rhs.scev_;
  this_local = (LoopPeelingInfo *)rhs.node_;
  lhs_cst.node_ = (SENode *)lhs.scev_;
  rec_node = (SERecurrentNode *)lhs.node_;
  lhs_cst.scev_ = (ScalarEvolutionAnalysis *)this;
  rhs_local.scev_ = (ScalarEvolutionAnalysis *)rec_node;
  lhs_local.node_ = lhs_cst.node_;
  pSVar2 = SExpression::operator->((SExpression *)&rhs_local.scev_);
  iVar1 = (*pSVar2->_vptr_SENode[6])();
  if ((SERecurrentNode *)CONCAT44(extraout_var,iVar1) != (SERecurrentNode *)0x0) {
    pSVar2 = SERecurrentNode::GetOffset((SERecurrentNode *)CONCAT44(extraout_var,iVar1));
    SExpression::SExpression((SExpression *)&rhs_cst.scev_,pSVar2);
    rec_node = (SERecurrentNode *)rhs_cst.scev_;
    lhs_cst.node_ = local_58;
  }
  rec_node_1 = (SERecurrentNode *)this_local;
  rhs_cst.node_ = rhs_local.node_;
  pSVar2 = SExpression::operator->((SExpression *)&this_local);
  iVar1 = (*pSVar2->_vptr_SENode[6])();
  local_78 = (SERecurrentNode *)CONCAT44(extraout_var_00,iVar1);
  if (local_78 != (SERecurrentNode *)0x0) {
    pSVar2 = SERecurrentNode::GetOffset(local_78);
    SExpression::SExpression(&local_88,pSVar2);
    rec_node_1 = (SERecurrentNode *)local_88.node_;
    rhs_cst.node_ = (SENode *)local_88.scev_;
  }
  pSVar2 = SExpression::operator_cast_to_SENode_((SExpression *)&rec_node);
  pSVar3 = SExpression::operator_cast_to_SENode_((SExpression *)&rec_node_1);
  if (pSVar2 == pSVar3) {
    lhs_cst_1.scev_._4_4_ = 1;
    lhs_cst_1.scev_._0_4_ = 1;
    std::pair<spvtools::opt::LoopPeelingPass::PeelDirection,_unsigned_int>::
    pair<spvtools::opt::LoopPeelingPass::PeelDirection,_int,_true>
              ((pair<spvtools::opt::LoopPeelingPass::PeelDirection,_unsigned_int> *)&lhs_local.scev_
               ,(PeelDirection *)((long)&lhs_cst_1.scev_ + 4),(int *)&lhs_cst_1.scev_);
  }
  else {
    rec_node_2 = (SERecurrentNode *)rhs_local.scev_;
    lhs_cst_1.node_ = lhs_local.node_;
    pSVar2 = SExpression::operator->((SExpression *)&rhs_local.scev_);
    iVar1 = (*pSVar2->_vptr_SENode[6])();
    if ((SERecurrentNode *)CONCAT44(extraout_var_01,iVar1) != (SERecurrentNode *)0x0) {
      join_0x00000010_0x00000000_ =
           GetValueAtLastIteration(this,(SERecurrentNode *)CONCAT44(extraout_var_01,iVar1));
      rec_node_2 = (SERecurrentNode *)rhs_cst_1.scev_;
      lhs_cst_1.node_ = (SENode *)local_b0;
    }
    rec_node_3 = (SERecurrentNode *)this_local;
    rhs_cst_1.node_ = rhs_local.node_;
    pSVar2 = SExpression::operator->((SExpression *)&this_local);
    iVar1 = (*pSVar2->_vptr_SENode[6])();
    local_d0 = (SERecurrentNode *)CONCAT44(extraout_var_02,iVar1);
    if (local_d0 != (SERecurrentNode *)0x0) {
      local_e0 = GetValueAtLastIteration(this,local_d0);
      rec_node_3 = (SERecurrentNode *)local_e0.node_;
      rhs_cst_1.node_ = (SENode *)local_e0.scev_;
    }
    pSVar2 = SExpression::operator_cast_to_SENode_((SExpression *)&rec_node_2);
    pSVar3 = SExpression::operator_cast_to_SENode_((SExpression *)&rec_node_3);
    if (pSVar2 == pSVar3) {
      local_e8[1] = 2;
      local_e8[0] = 1;
      std::pair<spvtools::opt::LoopPeelingPass::PeelDirection,_unsigned_int>::
      pair<spvtools::opt::LoopPeelingPass::PeelDirection,_int,_true>
                ((pair<spvtools::opt::LoopPeelingPass::PeelDirection,_unsigned_int> *)
                 &lhs_local.scev_,(PeelDirection *)(local_e8 + 1),local_e8);
    }
    else {
      lhs_local.scev_ = (ScalarEvolutionAnalysis *)GetNoneDirection();
    }
  }
  return (Direction)lhs_local.scev_;
}

Assistant:

LoopPeelingPass::LoopPeelingInfo::Direction
LoopPeelingPass::LoopPeelingInfo::HandleEquality(SExpression lhs,
                                                 SExpression rhs) const {
  {
    // Try peel before opportunity.
    SExpression lhs_cst = lhs;
    if (SERecurrentNode* rec_node = lhs->AsSERecurrentNode()) {
      lhs_cst = rec_node->GetOffset();
    }
    SExpression rhs_cst = rhs;
    if (SERecurrentNode* rec_node = rhs->AsSERecurrentNode()) {
      rhs_cst = rec_node->GetOffset();
    }

    if (lhs_cst == rhs_cst) {
      return Direction{LoopPeelingPass::PeelDirection::kBefore, 1};
    }
  }

  {
    // Try peel after opportunity.
    SExpression lhs_cst = lhs;
    if (SERecurrentNode* rec_node = lhs->AsSERecurrentNode()) {
      // rec_node(x) = a * x + b
      // assign to lhs: a * (loop_max_iterations_ - 1) + b
      lhs_cst = GetValueAtLastIteration(rec_node);
    }
    SExpression rhs_cst = rhs;
    if (SERecurrentNode* rec_node = rhs->AsSERecurrentNode()) {
      // rec_node(x) = a * x + b
      // assign to lhs: a * (loop_max_iterations_ - 1) + b
      rhs_cst = GetValueAtLastIteration(rec_node);
    }

    if (lhs_cst == rhs_cst) {
      return Direction{LoopPeelingPass::PeelDirection::kAfter, 1};
    }
  }

  return GetNoneDirection();
}